

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

int __thiscall ON_BinaryArchive::Read3dmMaterial(ON_BinaryArchive *this,ON_Material **ppMaterial)

{
  bool bVar1;
  int iVar2;
  ON_Object *local_50;
  ON_Object *p;
  ON_Material *V1_material;
  ON__INT64 big_value;
  ON_Material *pOStack_30;
  ON__UINT32 tcode;
  ON_Material *material;
  ON_Material **ppOStack_20;
  int rc;
  ON_Material **ppMaterial_local;
  ON_BinaryArchive *this_local;
  
  ppOStack_20 = ppMaterial;
  ppMaterial_local = (ON_Material **)this;
  bVar1 = Read3dmTableRecord(this,material_table,ppMaterial);
  if (bVar1) {
    pOStack_30 = (ON_Material *)0x0;
    big_value._4_4_ = 0;
    V1_material = (ON_Material *)0x0;
    if (this->m_3dm_version == 1) {
      p = (ON_Object *)0x0;
      material._4_4_ = Read3dmV1Material(this,(ON_Material **)&p);
      if (p != (ON_Object *)0x0) {
        bVar1 = ON_ModelComponent::IdIsNil((ON_ModelComponent *)p);
        if (bVar1) {
          ON_ModelComponent::SetId((ON_ModelComponent *)p);
        }
        Internal_Read3dmUpdateManifest(this,(ON_ModelComponent *)p);
        if (ppOStack_20 == (ON_Material **)0x0) {
          if (p != (ON_Object *)0x0) {
            (*p->_vptr_ON_Object[4])();
          }
        }
        else {
          *ppOStack_20 = (ON_Material *)p;
        }
      }
    }
    else {
      material._4_4_ = -1;
      bVar1 = BeginRead3dmBigChunk(this,(uint *)((long)&big_value + 4),(ON__INT64 *)&V1_material);
      if (bVar1) {
        if (big_value._4_4_ == 0x20008040) {
          Internal_Increment3dmTableItemCount(this);
          local_50 = (ON_Object *)0x0;
          iVar2 = ReadObject(this,&local_50);
          if (iVar2 != 0) {
            pOStack_30 = ON_Material::Cast(local_50);
            if (pOStack_30 == (ON_Material *)0x0) {
              if (local_50 != (ON_Object *)0x0) {
                (*local_50->_vptr_ON_Object[4])();
              }
            }
            else {
              bVar1 = ON_ModelComponent::IdIsNil(&pOStack_30->super_ON_ModelComponent);
              if (bVar1) {
                ON_ModelComponent::SetId(&pOStack_30->super_ON_ModelComponent);
              }
              Internal_Read3dmUpdateManifest(this,&pOStack_30->super_ON_ModelComponent);
              if (ppOStack_20 != (ON_Material **)0x0) {
                *ppOStack_20 = pOStack_30;
              }
              material._4_4_ = 1;
            }
          }
          if (pOStack_30 == (ON_Material *)0x0) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                       ,0x31e2,"","ON_BinaryArchive::Read3dmMaterial() - corrupt material table");
          }
        }
        else if (big_value._4_4_ == -1) {
          material._4_4_ = 0;
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x31ec,"","ON_BinaryArchive::Read3dmMaterial() - corrupt material table");
        }
        bVar1 = EndRead3dmChunk(this);
        if (!bVar1) {
          material._4_4_ = -1;
        }
      }
    }
    this_local._4_4_ = material._4_4_;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int ON_BinaryArchive::Read3dmMaterial( ON_Material** ppMaterial )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::material_table, (void**)ppMaterial))
    return 0;

  int rc;
  ON_Material* material = nullptr;
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  if ( m_3dm_version == 1 ) 
  {
    ON_Material* V1_material = nullptr;
    rc = ON_BinaryArchive::Read3dmV1Material( &V1_material );
    if (nullptr != V1_material)
    {
      if ( V1_material->IdIsNil() )
        V1_material->SetId();
      Internal_Read3dmUpdateManifest(*V1_material);
      if (ppMaterial)
        *ppMaterial = V1_material;
      else
        delete V1_material;
    }
  }
  else 
  {
    // version 2+
    rc = -1;
    if ( BeginRead3dmBigChunk( &tcode, &big_value ) )
    {
      if ( tcode == TCODE_MATERIAL_RECORD ) 
      {
        Internal_Increment3dmTableItemCount();
        ON_Object* p = 0;
        if ( ReadObject( &p ) ) 
        {
          material = ON_Material::Cast(p);
          if ( !material )
            delete p;
          else 
          {
            if ( material->IdIsNil() )
              material->SetId();
            Internal_Read3dmUpdateManifest(*material);
            if ( ppMaterial )
              *ppMaterial = material;
            rc = 1;
          }
        }
        if (!material)
        {
          ON_ERROR("ON_BinaryArchive::Read3dmMaterial() - corrupt material table");
        }
      }
      else if ( tcode == TCODE_ENDOFTABLE ) 
      {
        // end of material table
        rc = 0;
      }
      else 
      {
        ON_ERROR("ON_BinaryArchive::Read3dmMaterial() - corrupt material table");
      }
      if ( !EndRead3dmChunk() )
        rc = -1;
    }
  }
  return rc;
}